

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O2

btScalar __thiscall
btHingeConstraint::getHingeAngle(btHingeConstraint *this,btTransform *transA,btTransform *transB)

{
  float fVar1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar2;
  undefined4 uVar3;
  btVector3 bVar4;
  btVector3 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  uVar2 = 0;
  uVar3 = 0;
  local_78.m_floats[1] = (this->m_rbAFrame).m_basis.m_el[1].m_floats[0];
  local_78.m_floats[0] = (btScalar)(int)*(undefined8 *)(this->m_rbAFrame).m_basis.m_el[0].m_floats;
  local_78.m_floats[2] = (this->m_rbAFrame).m_basis.m_el[2].m_floats[0];
  local_78.m_floats[3] = 0.0;
  bVar4 = operator*(&transA->m_basis,&local_78);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = bVar4.m_floats._0_8_;
  local_48._12_4_ = extraout_XMM0_Dd;
  local_38._8_4_ = uVar2;
  local_38._0_8_ = bVar4.m_floats._8_8_;
  local_38._12_4_ = uVar3;
  uVar2 = 0;
  uVar3 = 0;
  local_78.m_floats[1] = (this->m_rbAFrame).m_basis.m_el[1].m_floats[1];
  local_78.m_floats[0] =
       (btScalar)(int)*(undefined8 *)((this->m_rbAFrame).m_basis.m_el[0].m_floats + 1);
  local_78.m_floats[2] = (this->m_rbAFrame).m_basis.m_el[2].m_floats[1];
  local_78.m_floats[3] = 0.0;
  bVar4 = operator*(&transA->m_basis,&local_78);
  local_68._8_4_ = extraout_XMM0_Dc_00;
  local_68._0_8_ = bVar4.m_floats._0_8_;
  local_68._12_4_ = extraout_XMM0_Dd_00;
  local_58._8_4_ = uVar2;
  local_58._0_8_ = bVar4.m_floats._8_8_;
  local_58._12_4_ = uVar3;
  local_78.m_floats[1] = (this->m_rbBFrame).m_basis.m_el[1].m_floats[1];
  local_78.m_floats[0] =
       (btScalar)(int)*(undefined8 *)((this->m_rbBFrame).m_basis.m_el[0].m_floats + 1);
  local_78.m_floats[2] = (this->m_rbBFrame).m_basis.m_el[2].m_floats[1];
  local_78.m_floats[3] = 0.0;
  bVar4 = operator*(&transB->m_basis,&local_78);
  fVar1 = atan2f((float)local_38._0_4_ * bVar4.m_floats[2] +
                 (float)local_48._4_4_ * bVar4.m_floats[1] +
                 bVar4.m_floats[0] * (float)local_48._0_4_,
                 bVar4.m_floats[2] * (float)local_58._0_4_ +
                 (float)local_68._0_4_ * bVar4.m_floats[0] +
                 (float)local_68._4_4_ * bVar4.m_floats[1]);
  return fVar1 * this->m_referenceSign;
}

Assistant:

btScalar btHingeConstraint::getHingeAngle(const btTransform& transA,const btTransform& transB)
{
	const btVector3 refAxis0  = transA.getBasis() * m_rbAFrame.getBasis().getColumn(0);
	const btVector3 refAxis1  = transA.getBasis() * m_rbAFrame.getBasis().getColumn(1);
	const btVector3 swingAxis = transB.getBasis() * m_rbBFrame.getBasis().getColumn(1);
//	btScalar angle = btAtan2Fast(swingAxis.dot(refAxis0), swingAxis.dot(refAxis1));
	btScalar angle = btAtan2(swingAxis.dot(refAxis0), swingAxis.dot(refAxis1));
	return m_referenceSign * angle;
}